

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SerializeWithCachedSizes
          (ExtensionSet *this,int start_field_number,int end_field_number,CodedOutputStream *output)

{
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  local_28;
  const_iterator iter;
  CodedOutputStream *output_local;
  int end_field_number_local;
  int start_field_number_local;
  ExtensionSet *this_local;
  
  iter._M_node = (_Base_ptr)output;
  output_local._0_4_ = end_field_number;
  output_local._4_4_ = start_field_number;
  _end_field_number_local = this;
  std::
  _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  ::_Rb_tree_const_iterator(&local_28);
  local_30 = (_Base_ptr)
             std::
             map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
             ::lower_bound(&this->extensions_,(key_type *)((long)&output_local + 4));
  local_28._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
         ::end(&this->extensions_);
    bVar2 = std::operator!=(&local_28,&local_38);
    bVar1 = false;
    if (bVar2) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_28);
      bVar1 = ppVar3->first < (int)output_local;
    }
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_28);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_28);
    Extension::SerializeFieldWithCachedSizes
              (&ppVar3->second,ppVar4->first,(CodedOutputStream *)iter._M_node);
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void ExtensionSet::SerializeWithCachedSizes(
    int start_field_number, int end_field_number,
    io::CodedOutputStream* output) const {
  map<int, Extension>::const_iterator iter;
  for (iter = extensions_.lower_bound(start_field_number);
       iter != extensions_.end() && iter->first < end_field_number;
       ++iter) {
    iter->second.SerializeFieldWithCachedSizes(iter->first, output);
  }
}